

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

int mpt_connect(mpt_socket *sd,char *where,mpt_fdmode *mode)

{
  ushort uVar1;
  mpt_fdmode mVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  mpt_fdmode local_20;
  
  if (where == (char *)0x0) {
    if (-1 < sd->_id) {
      close(sd->_id);
      return 1;
    }
    return 0;
  }
  if (mode == (mpt_fdmode *)0x0) {
    uVar5 = mpt_mode_parse(&local_20,where);
    mVar2 = local_20;
    if (-1 < (int)uVar5) {
      if (uVar5 == 0) {
        local_20._0_2_ = local_20._0_2_ & 0xff00;
        local_20.stream = mVar2.stream;
        local_20.param = (anon_union_4_2_317a4d69_for_param)0x1;
        iVar3 = socketSet(where,&local_20,bind);
        uVar5 = 0;
        if (iVar3 < 0) {
          return iVar3;
        }
      }
      goto LAB_00103de1;
    }
LAB_00103eb9:
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    uVar5 = 0xffffffff;
  }
  else {
    local_20 = *mode;
    uVar5 = 0;
LAB_00103de1:
    if (local_20.family < '\0') {
      if (((ulong)local_20 & 0x20000) != 0) goto LAB_00103eb9;
      iVar3 = open(where + uVar5,(uint)local_20.param.file.open,(ulong)local_20 >> 0x20 & 0xffff);
      if (iVar3 < 0) {
        return iVar3;
      }
      uVar1 = local_20.param.file.open & 1;
      local_20.stream = 6 - uVar1;
    }
    else {
      iVar3 = socketSet(where + uVar5,&local_20,connect);
      if (iVar3 < 0) {
        return iVar3;
      }
    }
    if (-1 < sd->_id) {
      close(sd->_id);
    }
    sd->_id = iVar3;
    uVar5 = (uint)local_20.stream;
  }
  return uVar5;
}

Assistant:

extern int mpt_connect(MPT_STRUCT(socket) *sd, const char *where, const MPT_STRUCT(fdmode) *mode)
{
	MPT_STRUCT(fdmode) info;
	int type, sock;
	
	if (!where) {
		if (sd->_id >= 0) {
			(void) close(sd->_id);
			return 1;
		}
		return 0;
	}
	if (mode) {
		info = *mode;
		type = 0;
	}
	else if ((type = mpt_mode_parse(&info, where)) < 0) {
		errno = EINVAL;
		return -1;
	}
	else if (!type) {
		info.family = AF_UNSPEC;
		info.param.sock.type = SOCK_STREAM;
		info.param.sock.proto = 0;
		info.param.sock.port = 0;
		if ((sock = socketSet(where, &info, bind)) < 0) {
			return sock;
		}
	}
	/* one-way type connection */
	if (info.family < 0) {
		if (info.param.file.open & O_RDWR) {
			errno = EINVAL;
			return -1;
		}
		if ((sock = open(where + type, info.param.file.open, info.param.file.perm)) < 0) {
			return sock;
		}
		info.stream  = (info.param.file.open & O_WRONLY) ? MPT_SOCKETFLAG(Write) : MPT_SOCKETFLAG(Read);
		info.stream |= MPT_SOCKETFLAG(Stream);
	}
	else if ((sock = socketSet(where + type, &info, connect)) < 0) {
		return sock;
	}
	if (sd->_id >= 0) {
		(void) close(sd->_id);
	}
	sd->_id = sock;
	return info.stream;
}